

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O2

Vec_Wrd_t * Gia_ManComputeTruths(Gia_Man_t *p,int nCutSize,int nLutNum,int fReverse)

{
  int *piVar1;
  int iVar2;
  word wVar3;
  int iVar4;
  ulong uVar5;
  Vec_Wrd_t *pVVar6;
  word *__ptr;
  Gia_Obj_t *pRoot;
  word *pwVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  int Id;
  ulong uVar11;
  int i;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t vLeaves;
  
  bVar8 = (char)nCutSize - 6;
  uVar9 = 1;
  uVar15 = 0;
  uVar5 = (ulong)(uint)(1 << (bVar8 & 0x1f));
  if (1 << (bVar8 & 0x1f) < 1) {
    uVar5 = uVar15;
  }
  if (nCutSize < 7) {
    bVar8 = 0;
  }
  uVar13 = nLutNum << (bVar8 & 0x1f);
  pVVar6 = (Vec_Wrd_t *)malloc(0x10);
  if (uVar13 - 1 < 0xf) {
    uVar13 = 0x10;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar13;
  if (uVar13 == 0) {
    __ptr = (word *)0x0;
  }
  else {
    __ptr = (word *)malloc((long)(int)uVar13 << 3);
  }
  pVVar6->pArray = __ptr;
  Gia_ObjComputeTruthTableStart(p,nCutSize);
  if (nCutSize < 7) {
    uVar5 = uVar9;
  }
  do {
    Id = (int)uVar9;
    if (p->nObjs <= Id) {
      Gia_ObjComputeTruthTableStop(p);
      if ((uVar13 != 0x10) && ((uint)uVar15 != uVar13)) {
        __assert_fail("Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                      ,0xa4,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)");
      }
      return pVVar6;
    }
    iVar4 = Gia_ObjIsLut(p,Id);
    if (iVar4 != 0) {
      vLeaves.nCap = Gia_ObjLutSize(p,Id);
      vLeaves.nSize = vLeaves.nCap;
      vLeaves.pArray = Gia_ObjLutFanins(p,Id);
      uVar9 = 0;
      if (0 < vLeaves.nSize) {
        uVar9 = (ulong)(uint)vLeaves.nSize;
      }
      lVar10 = 1;
      uVar11 = 0;
      while (uVar11 != uVar9) {
        lVar12 = lVar10;
        while ((int)lVar12 < vLeaves.nSize) {
          piVar1 = vLeaves.pArray + lVar12;
          lVar12 = lVar12 + 1;
          if (vLeaves.pArray[uVar11] == *piVar1) {
            __assert_fail("Vec_IntCheckUniqueSmall(&vLeaves)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                          ,0x99,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)");
          }
        }
        lVar10 = lVar10 + 1;
        uVar11 = uVar11 + 1;
      }
      Vec_IntSelectSort(vLeaves.pArray,vLeaves.nSize);
      if (fReverse == 0) {
        iVar4 = -1;
        for (lVar10 = 0; lVar10 < vLeaves.nSize / 2; lVar10 = lVar10 + 1) {
          iVar2 = vLeaves.pArray[lVar10];
          vLeaves.pArray[lVar10] = vLeaves.pArray[vLeaves.nSize + iVar4];
          vLeaves.pArray[vLeaves.nSize + iVar4] = iVar2;
          iVar4 = iVar4 + -1;
        }
      }
      pRoot = Gia_ManObj(p,Id);
      pwVar7 = Gia_ObjComputeTruthTableCut(p,pRoot,&vLeaves);
      uVar15 = (long)(int)(uint)uVar15;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        wVar3 = pwVar7[uVar9];
        if ((uint)uVar15 == uVar13) {
          uVar14 = uVar13 * 2;
          if ((int)uVar13 < 0x10) {
            uVar14 = 0x10;
          }
          if ((int)uVar13 < (int)uVar14) {
            if (__ptr == (word *)0x0) {
              __ptr = (word *)malloc((ulong)uVar14 << 3);
            }
            else {
              __ptr = (word *)realloc(__ptr,(ulong)uVar14 << 3);
            }
            pVVar6->pArray = __ptr;
            if (__ptr == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                            ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar6->nCap = uVar14;
            uVar13 = uVar14;
          }
        }
        pVVar6->nSize = (int)(uVar15 + 1);
        __ptr[uVar15] = wVar3;
        uVar15 = uVar15 + 1;
      }
    }
    uVar9 = (ulong)(Id + 1);
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManComputeTruths( Gia_Man_t * p, int nCutSize, int nLutNum, int fReverse )
{
    Vec_Wrd_t * vTruths;
    Vec_Int_t vLeaves;
    word * pTruth;
    int i, k, nWords;
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Vec_WrdAlloc( nWords * nLutNum );
    Gia_ObjComputeTruthTableStart( p, nCutSize );
    Gia_ManForEachLut( p, i )
    {
        // collect and sort fanins
        vLeaves.nCap = vLeaves.nSize = Gia_ObjLutSize( p, i );
        vLeaves.pArray = Gia_ObjLutFanins( p, i );
        assert( Vec_IntCheckUniqueSmall(&vLeaves) );
        Vec_IntSelectSort( Vec_IntArray(&vLeaves), Vec_IntSize(&vLeaves) );
        if ( !fReverse )
            Vec_IntReverseOrder( &vLeaves );
        // compute truth table
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), &vLeaves );
        for ( k = 0; k < nWords; k++ )
            Vec_WrdPush( vTruths, pTruth[k] );
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );
    assert( Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths) );
    return vTruths;
}